

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

unsigned_long * bn_expand_internal(BIGNUM *b,int words)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  int iVar4;
  int in_ESI;
  BIGNUM *in_RDI;
  unsigned_long a3;
  unsigned_long a2;
  unsigned_long a1;
  unsigned_long a0;
  int i;
  unsigned_long *B;
  unsigned_long *a;
  unsigned_long *A;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  int local_34;
  unsigned_long *local_30;
  unsigned_long *local_20;
  unsigned_long *local_8;
  
  if (in_ESI < 0x800000) {
    iVar4 = BN_get_flags(in_RDI,2);
    if (iVar4 == 0) {
      iVar4 = BN_get_flags(in_RDI,8);
      if (iVar4 == 0) {
        local_20 = (unsigned_long *)CRYPTO_zalloc(in_stack_ffffffffffffffa0);
      }
      else {
        local_20 = (unsigned_long *)CRYPTO_secure_zalloc(in_stack_ffffffffffffff98);
      }
      local_8 = local_20;
      if (local_20 == (unsigned_long *)0x0) {
        local_8 = (unsigned_long *)0x0;
      }
      else {
        local_30 = in_RDI->d;
        if (local_30 != (unsigned_long *)0x0) {
          for (local_34 = in_RDI->top >> 2; 0 < local_34; local_34 = local_34 + -1) {
            uVar1 = local_30[1];
            uVar2 = local_30[2];
            uVar3 = local_30[3];
            *local_20 = *local_30;
            local_20[1] = uVar1;
            local_20[2] = uVar2;
            local_20[3] = uVar3;
            local_20 = local_20 + 4;
            local_30 = local_30 + 4;
          }
          switch(in_RDI->top & 3) {
          case 3:
            local_20[2] = local_30[2];
          case 2:
            local_20[1] = local_30[1];
          case 1:
            *local_20 = *local_30;
          case 0:
          }
        }
      }
    }
    else {
      local_8 = (unsigned_long *)0x0;
    }
  }
  else {
    local_8 = (unsigned_long *)0x0;
  }
  return local_8;
}

Assistant:

static BN_ULONG *bn_expand_internal(const BIGNUM *b, int words)
{
    BN_ULONG *A, *a = NULL;
    const BN_ULONG *B;
    int i;

    bn_check_top(b);

    if (words > (INT_MAX / (4 * BN_BITS2))) {
        //BNerr(BN_F_BN_EXPAND_INTERNAL, BN_R_BIGNUM_TOO_LONG);
        return NULL;
    }
    if (BN_get_flags(b, BN_FLG_STATIC_DATA)) {
        //BNerr(BN_F_BN_EXPAND_INTERNAL, BN_R_EXPAND_ON_STATIC_BIGNUM_DATA);
        return (NULL);
    }
    if (BN_get_flags(b, BN_FLG_SECURE))
        a = A =  CRYPTO_secure_zalloc(words * sizeof(*a));
    else
        a = A = CRYPTO_zalloc(words * sizeof(*a));
    if (A == NULL) {
        //BNerr(BN_F_BN_EXPAND_INTERNAL, ERR_R_MALLOC_FAILURE);
        return (NULL);
    }

#if 1
    B = b->d;
    /* Check if the previous number needs to be copied */
    if (B != NULL) {
        for (i = b->top >> 2; i > 0; i--, A += 4, B += 4) {
            /*
             * The fact that the loop is unrolled
             * 4-wise is a tribute to Intel. It's
             * the one that doesn't have enough
             * registers to accommodate more data.
             * I'd unroll it 8-wise otherwise:-)
             *
             *              <appro@fy.chalmers.se>
             */
            BN_ULONG a0, a1, a2, a3;
            a0 = B[0];
            a1 = B[1];
            a2 = B[2];
            a3 = B[3];
            A[0] = a0;
            A[1] = a1;
            A[2] = a2;
            A[3] = a3;
        }
        switch (b->top & 3) {
        case 3:
            A[2] = B[2];
        case 2:
            A[1] = B[1];
        case 1:
            A[0] = B[0];
        case 0:
            /* Without the "case 0" some old optimizers got this wrong. */
            ;
        }
    }
#else
    memset(A, 0, sizeof(*A) * words);
    memcpy(A, b->d, sizeof(b->d[0]) * b->top);
#endif

    return (a);
}